

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O3

void __thiscall Or::jumping(Or *this,int t,int f)

{
  element_type *peVar1;
  uint i;
  
  i = t;
  if (t == 0) {
    i = Node::labels + 1;
    Node::labels = i;
  }
  peVar1 = (this->super_Logical).expr1.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar1->super_Node)._vptr_Node[4])(peVar1,(ulong)i,0);
  peVar1 = (this->super_Logical).expr2.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar1->super_Node)._vptr_Node[4])(peVar1,(ulong)(uint)t,(ulong)(uint)f);
  if (t != 0) {
    return;
  }
  Node::emitlabel((Node *)this,i);
  return;
}

Assistant:

void jumping(int t, int f) override {
		int label = t != 0 ? t : newlabel();
		expr1->jumping(label, 0);
		expr2->jumping(t, f);
		if (t == 0) emitlabel(label);

	}